

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::dless(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  requireDStackDepth(this,4,"D<");
  this_00 = &this->dStack;
  uVar1 = ForthStack<unsigned_int>::getTop(this_00,1);
  uVar2 = ForthStack<unsigned_int>::getTop(this_00);
  uVar3 = ForthStack<unsigned_int>::getTop(this_00,3);
  uVar4 = ForthStack<unsigned_int>::getTop(this_00,2);
  ForthStack<unsigned_int>::pop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  ForthStack<unsigned_int>::setTop
            (this_00,0,(&this->False)[CONCAT44(uVar4,uVar3) < CONCAT44(uVar2,uVar1)]);
  return;
}

Assistant:

void dless(){
			REQUIRE_DSTACK_DEPTH(4, "D<");
			DCell d2(dStack.getTop(1), dStack.getTop());
			DCell d1(dStack.getTop(3), dStack.getTop(2));
			auto result = d1.data_.SDcells<d2.data_.SDcells;
			dStack.pop();dStack.pop();dStack.pop();
			dStack.setTop(0, result? True : False);
		}